

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

int utf8ncmp(void *src1,void *src2,size_t n)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  uchar *s2;
  uchar *s1;
  
  sVar3 = 0;
  while( true ) {
    bVar1 = *(byte *)((long)src1 + sVar3);
    if (((bVar1 == 0) && (*(char *)((long)src2 + sVar3) == '\0')) || (n == sVar3)) {
      return 0;
    }
    bVar2 = *(byte *)((long)src2 + sVar3);
    if (bVar1 < bVar2) {
      return -1;
    }
    if (bVar1 >= bVar2 && bVar1 != bVar2) break;
    sVar3 = sVar3 + 1;
  }
  return 1;
}

Assistant:

int utf8ncmp(const void *src1, const void *src2, size_t n) {
  const unsigned char *s1 = (const unsigned char *)src1;
  const unsigned char *s2 = (const unsigned char *)src2;

  while ((('\0' != *s1) || ('\0' != *s2)) && (0 != n--)) {
    if (*s1 < *s2) {
      return -1;
    } else if (*s1 > *s2) {
      return 1;
    }

    s1++;
    s2++;
  }

  // both utf8 strings matched
  return 0;
}